

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnDataSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index segment,
          uint32_t offset,uint32_t size)

{
  Result RVar1;
  size_type sVar2;
  const_pointer pcVar3;
  Index segment_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderObjdump *)name.data_;
  sVar2 = string_view::length((string_view *)&this_local);
  pcVar3 = string_view::data((string_view *)&this_local);
  PrintDetails(this,"   - %d: D <%.*s>",(ulong)index,sVar2 & 0xffffffff,pcVar3);
  if ((flags & 0x10) == 0) {
    PrintDetails(this," segment=%u offset=%d size=%d",(ulong)segment,(ulong)offset,(ulong)size);
  }
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnDataSymbol(Index index,
                                         uint32_t flags,
                                         string_view name,
                                         Index segment,
                                         uint32_t offset,
                                         uint32_t size) {
  PrintDetails("   - %d: D <" PRIstringview ">", index,
               WABT_PRINTF_STRING_VIEW_ARG(name));
  if (!(flags & WABT_SYMBOL_FLAG_UNDEFINED))
    PrintDetails(" segment=%" PRIindex " offset=%d size=%d", segment, offset,
                 size);
  return PrintSymbolFlags(flags);
}